

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void disas_addsubq(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx;
  int opsize;
  TCGv_i32 pTVar1;
  TCGv_i32 arg2;
  TCGv_i32 ret;
  uint insn_00;
  undefined6 in_register_00000012;
  ulong uVar2;
  uint val;
  int iVar3;
  TCGv_i32 addr;
  
  insn_00 = (uint)CONCAT62(in_register_00000012,insn);
  uVar2 = CONCAT62(in_register_00000012,insn) & 0xffffffff;
  tcg_ctx = s->uc->tcg_ctx;
  if ((insn_00 & 0x38) == 8) {
    opsize = 2;
  }
  else {
    opsize = insn_opsize(insn_00);
  }
  pTVar1 = gen_ea(env,s,(uint16_t)uVar2,opsize,tcg_ctx->NULL_QREG,&addr,EA_LOADS,
                  (uint)((((s->base).tb)->flags >> 0xd & 1) == 0));
  if (pTVar1 != tcg_ctx->NULL_QREG) {
    uVar2 = uVar2 >> 9;
    val = 8;
    if ((uVar2 & 7) != 0) {
      val = (uint)uVar2 & 7;
    }
    arg2 = tcg_const_i32_m68k(tcg_ctx,val);
    ret = tcg_temp_new_i32(tcg_ctx);
    tcg_gen_mov_i32(tcg_ctx,ret,pTVar1);
    if ((insn_00 & 0x38) == 8) {
      if ((insn_00 >> 8 & 1) == 0) {
        tcg_gen_add_i32(tcg_ctx,ret,ret,arg2);
      }
      else {
        tcg_gen_sub_i32(tcg_ctx,ret,ret,arg2);
      }
    }
    else {
      if ((insn_00 >> 8 & 1) == 0) {
        tcg_gen_add_i32(tcg_ctx,ret,ret,arg2);
        tcg_gen_setcond_i32_m68k(tcg_ctx,TCG_COND_LTU,QREG_CC_X,ret,arg2);
        iVar3 = 2;
      }
      else {
        tcg_gen_setcond_i32_m68k(tcg_ctx,TCG_COND_LTU,QREG_CC_X,ret,arg2);
        tcg_gen_sub_i32(tcg_ctx,ret,ret,arg2);
        iVar3 = 5;
      }
      set_cc_op(s,iVar3 + opsize);
      gen_update_cc_add(tcg_ctx,ret,arg2,opsize);
    }
    tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(arg2 + (long)tcg_ctx));
    pTVar1 = gen_ea(env,s,insn,opsize,ret,&addr,EA_STORE,
                    (uint)((((s->base).tb)->flags >> 0xd & 1) == 0));
    if (pTVar1 != tcg_ctx->NULL_QREG) {
      tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
      return;
    }
  }
  gen_addr_fault(s);
  return;
}

Assistant:

DISAS_INSN(addsubq)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv src;
    TCGv dest;
    TCGv val;
    int imm;
    TCGv addr;
    int opsize;

    if ((insn & 070) == 010) {
        /* Operation on address register is always long.  */
        opsize = OS_LONG;
    } else {
        opsize = insn_opsize(insn);
    }
    SRC_EA(env, src, opsize, 1, &addr);
    imm = (insn >> 9) & 7;
    if (imm == 0) {
        imm = 8;
    }
    val = tcg_const_i32(tcg_ctx, imm);
    dest = tcg_temp_new(tcg_ctx);
    tcg_gen_mov_i32(tcg_ctx, dest, src);
    if ((insn & 0x38) == 0x08) {
        /*
         * Don't update condition codes if the destination is an
         * address register.
         */
        if (insn & 0x0100) {
            tcg_gen_sub_i32(tcg_ctx, dest, dest, val);
        } else {
            tcg_gen_add_i32(tcg_ctx, dest, dest, val);
        }
    } else {
        if (insn & 0x0100) {
            tcg_gen_setcond_i32(tcg_ctx, TCG_COND_LTU, QREG_CC_X, dest, val);
            tcg_gen_sub_i32(tcg_ctx, dest, dest, val);
            set_cc_op(s, CC_OP_SUBB + opsize);
        } else {
            tcg_gen_add_i32(tcg_ctx, dest, dest, val);
            tcg_gen_setcond_i32(tcg_ctx, TCG_COND_LTU, QREG_CC_X, dest, val);
            set_cc_op(s, CC_OP_ADDB + opsize);
        }
        gen_update_cc_add(tcg_ctx, dest, val, opsize);
    }
    tcg_temp_free(tcg_ctx, val);
    DEST_EA(env, insn, opsize, dest, &addr);
    tcg_temp_free(tcg_ctx, dest);
}